

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

PyObject * pybind11_meta_call(PyObject *type,PyObject *args,PyObject *kwargs)

{
  byte bVar1;
  pointer pptVar2;
  pointer pptVar3;
  byte bVar4;
  undefined8 uVar5;
  PyObject *pPVar6;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar7;
  long lVar8;
  ulong uVar9;
  type_info *ptVar10;
  ulong uVar11;
  bool bVar12;
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  pPVar6 = (PyObject *)(*_PyCFunction_Type)();
  if (pPVar6 == (PyObject *)0x0) {
LAB_0010b28e:
    pPVar6 = (PyObject *)0x0;
  }
  else {
    pvVar7 = pybind11::detail::all_type_info(pPVar6->ob_type);
    uVar5 = _PyExc_TypeError;
    pptVar2 = (pvVar7->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pptVar3 = (pvVar7->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pptVar2 == pptVar3) {
      ptVar10 = (type_info *)0x0;
    }
    else {
      ptVar10 = *pptVar2;
    }
    lVar8 = (long)pptVar3 - (long)pptVar2;
    if (lVar8 != 0) {
      uVar9 = lVar8 >> 3;
      bVar1 = (byte)pPVar6[3].ob_refcnt;
      uVar11 = 1;
      do {
        if ((bVar1 & 2) == 0) {
          bVar4 = *(byte *)((long)pPVar6[1].ob_type + (uVar11 - 1)) & 1;
        }
        else {
          bVar4 = bVar1 & 4;
        }
        if (bVar4 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_38,ptVar10->type->tp_name,&local_39);
          PyErr_Format(uVar5,"%.200s.__init__() must be called when overriding __init__",local_38[0]
                      );
          if (local_38[0] != local_28) {
            operator_delete(local_38[0],local_28[0] + 1);
          }
          pPVar6->ob_refcnt = pPVar6->ob_refcnt + -1;
          if (pPVar6->ob_refcnt == 0) {
            _Py_Dealloc(pPVar6);
          }
          goto LAB_0010b28e;
        }
        if (uVar11 < uVar9) {
          ptVar10 = pptVar2[uVar11];
        }
        else {
          ptVar10 = (type_info *)0x0;
        }
        bVar12 = uVar11 != uVar9;
        uVar11 = uVar11 + 1;
      } while (bVar12);
    }
  }
  return pPVar6;
}

Assistant:

inline PyObject *pybind11_meta_call(PyObject *type, PyObject *args, PyObject *kwargs) {

    // use the default metaclass call to create/initialize the object
    PyObject *self = PyType_Type.tp_call(type, args, kwargs);
    if (self == nullptr) {
        return nullptr;
    }

    // This must be a pybind11 instance
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Ensure that the base __init__ function(s) were called
    for (const auto &vh : values_and_holders(instance)) {
        if (!vh.holder_constructed()) {
            PyErr_Format(PyExc_TypeError, "%.200s.__init__() must be called when overriding __init__",
                         get_fully_qualified_tp_name(vh.type->type).c_str());
            Py_DECREF(self);
            return nullptr;
        }
    }

    return self;
}